

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O0

Stream * nv::operator<<(Stream *s,DDSHeader *header)

{
  bool bVar1;
  DDSHeader *header_local;
  Stream *s_local;
  
  operator<<(s,&header->fourcc);
  operator<<(s,&header->size);
  operator<<(s,&header->flags);
  operator<<(s,&header->height);
  operator<<(s,&header->width);
  operator<<(s,&header->pitch);
  operator<<(s,&header->depth);
  operator<<(s,&header->mipmapcount);
  (*s->_vptr_Stream[2])(s,header->reserved,0x2c);
  operator<<(s,&header->pf);
  operator<<(s,&header->caps);
  operator<<(s,&header->notused);
  bVar1 = DDSHeader::hasDX10Header(header);
  if (bVar1) {
    operator<<(s,&header->header10);
  }
  return s;
}

Assistant:

Stream & operator<< (Stream & s, DDSHeader & header)
	{
		nvStaticCheck(sizeof(DDSHeader) == 148);
		s << header.fourcc;
		s << header.size;
		s << header.flags;
		s << header.height;
		s << header.width;
		s << header.pitch;
		s << header.depth;
		s << header.mipmapcount;
		s.serialize(header.reserved, 11 * sizeof(uint));
		s << header.pf;
		s << header.caps;
		s << header.notused;
		
		if (header.hasDX10Header())
		{
			s << header.header10;
		}
		
		return s;
	}